

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::BufferedFile::fileno(BufferedFile *this,FILE *__stream)

{
  int error_code;
  undefined8 uVar1;
  CStringRef unaff_retaddr;
  int fd;
  BasicCStringRef<char> local_18;
  
  error_code = ::fileno((FILE *)this->file_);
  if (error_code == -1) {
    uVar1 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_18,"cannot get file descriptor");
    SystemError::SystemError((SystemError *)this,error_code,unaff_retaddr);
    __cxa_throw(uVar1,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return error_code;
}

Assistant:

int fmt::BufferedFile::fileno() const {
  int fd = FMT_POSIX_CALL(fileno FMT_ARGS(file_));
  if (fd == -1)
    FMT_THROW(SystemError(errno, "cannot get file descriptor"));
  return fd;
}